

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O2

mk_sched_conn * mk_server_listen_handler(mk_sched_worker *sched,void *data,mk_server *server)

{
  int remote_fd;
  int iVar1;
  undefined4 extraout_var;
  mk_sched_conn *pmVar2;
  undefined4 extraout_var_00;
  int *piVar3;
  char *pcVar4;
  
  remote_fd = mk_socket_accept(*(int *)((long)data + 0x48));
  if (remote_fd == -1) {
    return (mk_sched_conn *)CONCAT44(extraout_var,remote_fd);
  }
  pmVar2 = mk_sched_add_connection(remote_fd,(mk_server_listen *)data,sched,server);
  if (pmVar2 != (mk_sched_conn *)0x0) {
    iVar1 = mk_event_add(sched->loop,remote_fd,3,1,pmVar2);
    if (iVar1 == 0) {
      sched->accepted_connections = sched->accepted_connections + 1;
      return (mk_sched_conn *)CONCAT44(extraout_var_00,iVar1);
    }
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    mk_print(0x1001,"[server] Error registering file descriptor: %s",pcVar4);
  }
  pmVar2 = (mk_sched_conn *)
           (**(code **)(*(long *)(*(long *)((long)data + 0x50) + 0x50) + 0x18))
                     (*(long *)((long)data + 0x50),remote_fd);
  return pmVar2;
}

Assistant:

static inline
struct mk_sched_conn *mk_server_listen_handler(struct mk_sched_worker *sched,
                                               void *data,
                                               struct mk_server *server)
{
    int ret;
    int client_fd = -1;
    struct mk_sched_conn *conn;
    struct mk_server_listen *listener = data;

    client_fd = mk_socket_accept(listener->server_fd);
    if (mk_unlikely(client_fd == -1)) {
        MK_TRACE("[server] Accept connection failed: %s", strerror(errno));
        goto error;
    }

    conn = mk_sched_add_connection(client_fd, listener, sched, server);
    if (mk_unlikely(!conn)) {
        goto error;
    }

    ret = mk_event_add(sched->loop, client_fd,
                       MK_EVENT_CONNECTION, MK_EVENT_READ, conn);
    if (mk_unlikely(ret != 0)) {
        mk_err("[server] Error registering file descriptor: %s",
               strerror(errno));
        goto error;
    }

    sched->accepted_connections++;
    MK_TRACE("[server] New connection arrived: FD %i", client_fd);
    return conn;

error:
    if (client_fd != -1) {
        listener->network->network->close(listener->network, client_fd);
    }

    return NULL;
}